

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  Ch *pCVar4;
  double *pdVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  byte *pbVar17;
  byte *pbVar18;
  ulong i;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pcVar3 = is->src_;
  pCVar4 = is->head_;
  cVar2 = *pcVar3;
  pbVar17 = (byte *)(pcVar3 + (cVar2 == '-'));
  bVar8 = pcVar3[cVar2 == '-'];
  if (bVar8 == 0x30) {
    pbVar18 = pbVar17 + 1;
    i = 0;
    bVar9 = false;
    iVar10 = 0;
    uVar16 = 0;
    goto LAB_0011b864;
  }
  if ((byte)(bVar8 - 0x31) < 9) {
    uVar16 = bVar8 - 0x30;
    bVar8 = pbVar17[1];
    pbVar18 = pbVar17 + 1;
    i = 0;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar8 - 0x30)) {
LAB_0011bb9a:
        bVar9 = false;
        iVar10 = 0;
        goto LAB_0011b864;
      }
      iVar10 = 0;
      do {
        if ((0xccccccb < uVar16) && ((uVar16 != 0xccccccc || ('8' < (char)bVar8))))
        goto LAB_0011bd91;
        uVar16 = ((uint)bVar8 + uVar16 * 10) - 0x30;
        iVar10 = iVar10 + 1;
        bVar8 = pbVar18[1];
        pbVar18 = pbVar18 + 1;
      } while ((byte)(bVar8 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_0011bb9a;
      iVar10 = 0;
      do {
        if ((0x19999998 < uVar16) && ((uVar16 != 0x19999999 || ('5' < (char)bVar8))))
        goto LAB_0011bd91;
        uVar16 = ((uint)bVar8 + uVar16 * 10) - 0x30;
        iVar10 = iVar10 + 1;
        bVar8 = pbVar18[1];
        pbVar18 = pbVar18 + 1;
      } while ((byte)(bVar8 - 0x30) < 10);
    }
    i = 0;
    bVar9 = false;
    goto LAB_0011b864;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x335,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar14 = (long)pbVar17 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0011be69;
LAB_0011bd91:
  bVar9 = true;
  i = (ulong)uVar16;
LAB_0011b864:
  dVar19 = 0.0;
  if (bVar9) {
    bVar8 = *pbVar18;
    bVar12 = bVar8 - 0x30;
    if (cVar2 == '-') {
      while (bVar12 < 10) {
        if ((0xccccccccccccccb < i) && ((i != 0xccccccccccccccc || ('8' < (char)bVar8))))
        goto LAB_0011bce2;
        i = (ulong)(bVar8 & 0xf) + i * 10;
        iVar10 = iVar10 + 1;
        bVar8 = pbVar18[1];
        pbVar18 = pbVar18 + 1;
        bVar12 = bVar8 - 0x30;
      }
    }
    else {
      while (bVar12 < 10) {
        if ((0x1999999999999998 < i) && ((i != 0x1999999999999999 || ('5' < (char)bVar8))))
        goto LAB_0011bce2;
        i = (ulong)(bVar8 & 0xf) + i * 10;
        iVar10 = iVar10 + 1;
        bVar8 = pbVar18[1];
        pbVar18 = pbVar18 + 1;
        bVar12 = bVar8 - 0x30;
      }
    }
  }
  bVar6 = false;
  goto LAB_0011b9b6;
LAB_0011bce2:
  auVar22._8_4_ = (int)(i >> 0x20);
  auVar22._0_8_ = i;
  auVar22._12_4_ = 0x45300000;
  dVar19 = (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  bVar6 = true;
LAB_0011b9b6:
  if ((bVar6) && ((byte)(*pbVar18 - 0x30) < 10)) {
    lVar14 = (long)pbVar18 - (long)pCVar4;
    pbVar17 = pbVar18;
    do {
      if (1.7976931348623158e+307 <= dVar19) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x357,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar14;
        goto LAB_0011beec;
      }
      pbVar18 = pbVar17 + 1;
      dVar19 = dVar19 * 10.0 + (double)((char)*pbVar17 + -0x30);
      pbVar1 = pbVar17 + 1;
      lVar14 = lVar14 + 1;
      pbVar17 = pbVar18;
    } while ((byte)(*pbVar1 - 0x30) < 10);
  }
  iVar15 = 0;
  if (*pbVar18 == 0x2e) {
    pbVar17 = pbVar18 + 1;
    if (9 < (byte)(pbVar18[1] - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x364,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar4;
      goto LAB_0011beec;
    }
    iVar13 = 0;
    if (!bVar6) {
      uVar11 = (ulong)uVar16;
      if (bVar9) {
        uVar11 = i;
      }
      i = uVar11;
      bVar8 = *pbVar17;
      iVar13 = 0;
      if ('/' < (char)bVar8) {
        iVar13 = 0;
        pbVar18 = pbVar17;
        do {
          pbVar17 = pbVar18;
          if ((0x39 < bVar8) || (i >> 0x35 != 0)) break;
          pbVar17 = pbVar18 + 1;
          iVar13 = iVar13 + -1;
          i = (ulong)(bVar8 - 0x30) + i * 10;
          iVar10 = iVar10 + (uint)(i != 0);
          bVar8 = pbVar18[1];
          pbVar18 = pbVar17;
        } while ('/' < (char)bVar8);
      }
      auVar23._8_4_ = (int)(i >> 0x20);
      auVar23._0_8_ = i;
      auVar23._12_4_ = 0x45300000;
      dVar19 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar8 = *pbVar17;
    pbVar18 = pbVar17;
    while ((byte)(bVar8 - 0x30) < 10) {
      if (iVar10 < 0x11) {
        dVar19 = dVar19 * 10.0 + (double)(int)(bVar8 - 0x30);
        iVar13 = iVar13 + -1;
        if (0.0 < dVar19) {
          iVar10 = iVar10 + 1;
        }
      }
      pbVar17 = pbVar18 + 1;
      pbVar18 = pbVar18 + 1;
      bVar8 = *pbVar17;
    }
  }
  else {
    iVar13 = 0;
  }
  pbVar17 = pbVar18;
  if ((*pbVar18 | 0x20) == 0x65) {
    uVar11 = (ulong)uVar16;
    if (bVar9) {
      uVar11 = i;
    }
    if (!bVar6) {
      auVar21._8_4_ = (int)(uVar11 >> 0x20);
      auVar21._0_8_ = uVar11;
      auVar21._12_4_ = 0x45300000;
      dVar19 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      bVar6 = true;
    }
    if (pbVar18[1] == 0x2d) {
      pbVar17 = pbVar18 + 2;
      bVar7 = true;
    }
    else {
      if (pbVar18[1] == 0x2b) {
        pbVar17 = pbVar18 + 2;
      }
      else {
        pbVar17 = pbVar18 + 1;
      }
      bVar7 = false;
    }
    if ((byte)(*pbVar17 - 0x30) < 10) {
      pbVar18 = pbVar17 + 1;
      iVar15 = *pbVar17 - 0x30;
      if (bVar7) {
        bVar8 = *pbVar18;
        while ((byte)(bVar8 - 0x30) < 10) {
          iVar15 = (uint)bVar8 + iVar15 * 10 + -0x30;
          if (iVar15 < 0xccccccc) {
            pbVar18 = pbVar18 + 1;
          }
          else {
            do {
              pbVar17 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
            } while ((byte)(*pbVar17 - 0x30) < 10);
          }
          bVar8 = *pbVar18;
        }
      }
      else {
        pbVar17 = pbVar17 + (1 - (long)pCVar4);
        do {
          bVar8 = *pbVar18;
          bVar12 = bVar8 - 0x3a;
          if (bVar12 < 0xf6) goto LAB_0011bcbb;
          pbVar18 = pbVar18 + 1;
          iVar15 = (uint)bVar8 + iVar15 * 10 + -0x30;
          pbVar17 = pbVar17 + 1;
        } while (iVar15 <= 0x134 - iVar13);
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x3ae,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(byte **)(this + 0x38) = pbVar17;
LAB_0011bcbb:
        if (0xf5 < bVar12) {
          bVar7 = false;
          pbVar17 = pbVar18;
          goto LAB_0011bd9b;
        }
      }
      iVar10 = -iVar15;
      if (!bVar7) {
        iVar10 = iVar15;
      }
      iVar15 = iVar10;
      bVar7 = true;
      pbVar17 = pbVar18;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3b3,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar4;
      bVar7 = false;
      iVar15 = 0;
    }
LAB_0011bd9b:
    if (!bVar7) goto LAB_0011beec;
  }
  if (!bVar6) {
    if (bVar9) {
      if (cVar2 == '-') {
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-i);
      }
      else {
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint64(handler,i);
      }
    }
    else if (cVar2 == '-') {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int(handler,-uVar16);
    }
    else {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint(handler,uVar16);
    }
    if (bVar9 == false) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3d6,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar14 = (long)pbVar17 - (long)pCVar4;
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011be69:
      *(long *)(this + 0x38) = lVar14;
    }
    goto LAB_0011beec;
  }
  uVar16 = iVar15 + iVar13;
  if ((int)uVar16 < -0x134) {
    dVar20 = 0.0;
    if (-0x269 < (int)uVar16) {
      uVar16 = -uVar16 - 0x134;
      if (0x134 < uVar16) goto LAB_0011bf5f;
      dVar19 = dVar19 / 1e+308;
LAB_0011be82:
      dVar20 = dVar19 / *(double *)(internal::Pow10(int)::e + (ulong)uVar16 * 8);
    }
  }
  else {
    if ((int)uVar16 < 0) {
      uVar16 = -uVar16;
      if (0x134 < uVar16) goto LAB_0011bf5f;
      goto LAB_0011be82;
    }
    if (0x134 < uVar16) {
LAB_0011bf5f:
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    dVar20 = dVar19 * *(double *)(internal::Pow10(int)::e + (ulong)uVar16 * 8);
  }
  if (cVar2 == '-') {
    dVar20 = -dVar20;
  }
  if ((handler->stack_).stackEnd_ <= (handler->stack_).stackTop_ + 0x18) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&handler->stack_,1);
  }
  pdVar5 = (double *)(handler->stack_).stackTop_;
  (handler->stack_).stackTop_ = (char *)(pdVar5 + 3);
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  *(undefined4 *)(pdVar5 + 2) = 0x4206;
  *pdVar5 = dVar20;
LAB_0011beec:
  is->src_ = (Ch *)pbVar17;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, (parseFlags & kParseFullPrecisionFlag) != 0> s(*this, copy.s);

        // Parse minus
        bool minus = false;
        if (s.Peek() == '-') {
            minus = true;
            s.Take();
        }

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (s.Peek() == '0') {
            i = 0;
            s.TakePush();
        }
        else if (s.Peek() >= '1' && s.Peek() <= '9') {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 214748364) { // 2^31 = 2147483648
                        if (i != 214748364 || s.Peek() > '8') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 429496729) { // 2^32 - 1 = 4294967295
                        if (i != 429496729 || s.Peek() > '5') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        double d = 0.0;
        if (use64bit) {
            if (minus) 
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                     if (i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC)) // 2^63 = 9223372036854775808
                        if (i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                    if (i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999)) // 2^64 - 1 = 18446744073709551615
                        if (i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (d >= 1.7976931348623157e307) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (s.Peek() == '.') {
            s.Take();
            decimalPosition = s.Length();

            if (!(s.Peek() >= '0' && s.Peek() <= '9'))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;
        
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = (double)i64;
#else
                // Use double to store significand in 32-bit architecture
                d = use64bit ? (double)i64 : (double)i;
#endif
                useDouble = true;
            }

            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (d > 0.0)
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (s.Peek() == 'e' || s.Peek() == 'E') {
            if (!useDouble) {
                d = use64bit ? i64 : i;
                useDouble = true;
            }
            s.Take();

            bool expMinus = false;
            if (s.Peek() == '+')
                s.Take();
            else if (s.Peek() == '-') {
                s.Take();
                expMinus = true;
            }

            if (s.Peek() >= '0' && s.Peek() <= '9') {
                exp = s.Take() - '0';
                if (expMinus) {
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (s.Peek() >= '0' && s.Peek() <= '9')  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp > maxExp)
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;
        size_t length = s.Length();
        const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

        if (useDouble) {
            int p = exp + expFrac;
            if (parseFlags & kParseFullPrecisionFlag)
                d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
            else
                d = internal::StrtodNormalPrecision(d, p);

            cont = handler.Double(minus ? -d : d);
        }
        else {
            if (use64bit) {
                if (minus)
                    cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                else
                    cont = handler.Uint64(i64);
            }
            else {
                if (minus)
                    cont = handler.Int(static_cast<int32_t>(~i + 1));
                else
                    cont = handler.Uint(i);
            }
        }
        if (!cont)
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }